

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::current_path(path *__return_storage_ptr__,error_code *ec)

{
  error_category *peVar1;
  ulong uVar2;
  char *__buf;
  char *pcVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  int *piVar5;
  size_t sVar6;
  
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  uVar2 = pathconf(".",4);
  sVar6 = 0x1000;
  if (0x1000 < (int)uVar2) {
    sVar6 = uVar2 & 0xffffffff;
  }
  __buf = (char *)operator_new__(sVar6 + 1);
  pcVar3 = getcwd(__buf,sVar6);
  if (pcVar3 == (char *)0x0) {
    piVar5 = __errno_location();
    ec->_M_value = *piVar5;
    ec->_M_cat = peVar1;
    _Var4._M_current = (char *)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_dataplus._M_p = _Var4._M_current;
    (__return_storage_ptr__->_path)._M_string_length = 0;
  }
  else {
    sVar6 = strlen(__buf);
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__buf,__buf + sVar6);
    pcVar3 = (__return_storage_ptr__->_path)._M_dataplus._M_p;
    uVar2 = (__return_storage_ptr__->_path)._M_string_length;
    if ((((uVar2 < 3) || (*pcVar3 != '/')) || (pcVar3[1] != '/')) || (pcVar3[2] == '/')) {
      _Var4 = std::
              __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                        (pcVar3,pcVar3 + uVar2);
    }
    else {
      _Var4 = std::
              __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                        (pcVar3 + 2,pcVar3 + uVar2);
    }
    (__return_storage_ptr__->_path)._M_string_length =
         (long)_Var4._M_current - (long)(__return_storage_ptr__->_path)._M_dataplus._M_p;
  }
  *_Var4._M_current = '\0';
  operator_delete__(__buf);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path current_path(std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    DWORD pathlen = ::GetCurrentDirectoryW(0, 0);
    std::unique_ptr<wchar_t[]> buffer(new wchar_t[size_t(pathlen) + 1]);
    if (::GetCurrentDirectoryW(pathlen, buffer.get()) == 0) {
        ec = detail::make_system_error();
        return path();
    }
    return path(std::wstring(buffer.get()), path::native_format);
#else
    size_t pathlen = static_cast<size_t>(std::max(int(::pathconf(".", _PC_PATH_MAX)), int(PATH_MAX)));
    std::unique_ptr<char[]> buffer(new char[pathlen + 1]);
    if (::getcwd(buffer.get(), pathlen) == nullptr) {
        ec = detail::make_system_error();
        return path();
    }
    return path(buffer.get());
#endif
}